

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,SocketFactory *sf,io_context *io_context,string *address,string *port,
          bool port_reuse,int nominalBufferSize)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *in_RDI;
  byte in_R9B;
  int in_stack_00000008;
  iterator end;
  iterator endpoint_iterator;
  query query;
  resolver resolver;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffe30;
  flags in_stack_fffffffffffffe44;
  string *service;
  string *host;
  uchar *protocol;
  basic_resolver_query<asio::ip::tcp> *this_00;
  query *q;
  
  std::enable_shared_from_this<gmlc::networking::TcpServer>::enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::TcpServer> *)0x7e4cd5);
  (in_RDI->impl_).implementation_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX;
  service = (string *)&(in_RDI->impl_).executor_;
  SocketFactory::SocketFactory
            ((SocketFactory *)in_stack_fffffffffffffe30,
             (SocketFactory *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  std::mutex::mutex((mutex *)0x7e4d0a);
  host = (string *)&in_RDI[1].impl_.implementation_;
  std::
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ::vector((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
            *)0x7e4d1d);
  protocol = in_RDI[1].impl_.executor_.
             super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
             .super_any_executor_base.object_.data + 8;
  std::
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ::vector((vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
            *)0x7e4d30);
  in_RDI[1].impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_ = (void *)(long)in_stack_00000008;
  this_00 = (basic_resolver_query<asio::ip::tcp> *)
            &in_RDI[1].impl_.executor_.
             super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
             .super_any_executor_base.target_fns_;
  std::
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  ::function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
              *)in_stack_fffffffffffffe30);
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
  function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
            *)in_stack_fffffffffffffe30);
  q = (query *)&in_RDI[2].impl_.executor_.
                super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                .super_any_executor_base.object_fns_;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffe30);
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f);
  *(byte *)((long)&in_RDI[3].impl_.service_ + 1) = in_R9B & 1;
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::vector((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
            *)0x7e4dbd);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)host,(io_context *)service,
             in_stack_fffffffffffffe44);
  asio::ip::tcp::v4();
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (this_00,(protocol_type *)protocol,host,service,in_stack_fffffffffffffe44);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve(in_RDI,q);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffe30,
             (basic_resolver_iterator<asio::ip::tcp> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)0x7e4e54);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffe30);
  bVar1 = asio::ip::operator!=
                    ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffe30,
                     (basic_resolver_iterator<asio::ip::tcp> *)
                     CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  if (bVar1) {
    while (bVar1 = asio::ip::operator!=
                             ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffe30,
                              (basic_resolver_iterator<asio::ip::tcp> *)
                              CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28)), bVar1)
    {
      in_stack_fffffffffffffe30 =
           (basic_resolver_query<asio::ip::tcp> *)
           (in_RDI[1].impl_.executor_.
            super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
            .super_any_executor_base.object_.data + 8);
      asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
                ((basic_resolver_iterator<asio::ip::tcp> *)0x7e4ed0);
      asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
                ((basic_resolver_entry<asio::ip::tcp> *)
                 CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      std::
      vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
      ::push_back((vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
                   *)in_stack_fffffffffffffe30,
                  (value_type *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator++
                ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffe30);
    }
    initialConnect((TcpServer *)query.service_name_.field_2._8_8_);
  }
  else {
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f);
  }
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x7e4ffa);
  asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)0x7e5007);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(in_stack_fffffffffffffe30);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::~basic_resolver
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffe30);
  return;
}

Assistant:

TcpServer::TcpServer(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& address,
    const std::string& port,
    bool port_reuse,
    int nominalBufferSize) :
    ioctx(io_context), socket_factory(sf), bufferSize(nominalBufferSize),
    reuse_address(port_reuse)
{
    tcp::resolver resolver(io_context);
    tcp::resolver::query query(
        tcp::v4(), address, port, tcp::resolver::query::canonical_name);
    tcp::resolver::iterator endpoint_iterator = resolver.resolve(query);
    tcp::resolver::iterator end;
    if (endpoint_iterator != end) {
        while (endpoint_iterator != end) {
            endpoints.push_back(*endpoint_iterator);
            ++endpoint_iterator;
        }
    } else {
        halted = true;
        return;
    }
    initialConnect();
}